

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O3

void __thiscall thread_pool::join_all(thread_pool *this)

{
  pointer ptVar1;
  pointer ptVar2;
  
  LOCK();
  (this->m_running)._M_base._M_i = false;
  UNLOCK();
  std::condition_variable::notify_all();
  ptVar1 = (this->m_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar2 = (this->m_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    if ((ptVar2->_M_id)._M_thread != 0) {
      std::thread::join();
    }
  }
  return;
}

Assistant:

void join_all() {
    m_running = false;
    m_cv.notify_all();

    for (auto& j : m_threads) {
      try {
        if (j.joinable())
          j.join();
      }
      catch (const std::exception& ex) {
        assert(false);
      }
      catch (...) {
        assert(false);
      }
    }
  }